

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

void __thiscall jpgd::jpeg_decoder::H2V1ConvertFiltered(jpeg_decoder *this)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  long lVar4;
  uint8 uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long in_RDI;
  int bc;
  int gc;
  int rc;
  int cr;
  int cb;
  int w1;
  int w0;
  int cr1;
  int cb1;
  int b;
  int cr0;
  int cb0;
  int a;
  int c_x1;
  int c_x0;
  int y;
  int x;
  int row_x8;
  int half_image_x_size;
  uint8 *d0;
  int row;
  uint BLOCKS_PER_MCU;
  int in_stack_ffffffffffffff5c;
  jpeg_decoder *in_stack_ffffffffffffff60;
  uint local_24;
  uint8 *local_18;
  
  local_18 = *(uint8 **)(in_RDI + 0x34b8);
  for (local_24 = 0; (int)local_24 < *(int *)(in_RDI + 0xd8); local_24 = local_24 + 1) {
    lVar4 = *(long *)(in_RDI + 0x24a8);
    iVar6 = check_sample_buf_ofs(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    uVar7 = (uint)*(byte *)(lVar4 + iVar6);
    in_stack_ffffffffffffff60 = *(jpeg_decoder **)(in_RDI + 0x24a8);
    iVar6 = check_sample_buf_ofs(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    bVar1 = *(byte *)((long)in_stack_ffffffffffffff60->m_jmp_state[0].__jmpbuf + (long)iVar6);
    lVar4 = *(long *)(in_RDI + 0x24a8);
    iVar6 = check_sample_buf_ofs(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    bVar2 = *(byte *)(lVar4 + iVar6);
    lVar4 = *(long *)(in_RDI + 0x24a8);
    iVar6 = check_sample_buf_ofs(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    bVar3 = *(byte *)(lVar4 + iVar6);
    lVar4 = *(long *)(in_RDI + 0x24a8);
    iVar6 = check_sample_buf_ofs(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    iVar8 = 1;
    if ((local_24 & 1) != 0) {
      iVar8 = 3;
    }
    iVar9 = 3;
    if ((local_24 & 1) != 0) {
      iVar9 = 1;
    }
    iVar10 = (int)((uint)bVar1 * iVar8 + (uint)bVar3 * iVar9 + 2) >> 2;
    iVar11 = (int)((uint)bVar2 * iVar8 + (uint)*(byte *)(lVar4 + iVar6) * iVar9 + 2) >> 2;
    iVar6 = *(int *)(in_RDI + 0x2cb8 + (long)iVar11 * 4);
    iVar8 = *(int *)(in_RDI + 0x30b8 + (long)iVar10 * 4);
    iVar9 = *(int *)(in_RDI + 0x28b8 + (long)iVar10 * 4);
    uVar5 = clamp(uVar7 + *(int *)(in_RDI + 0x24b8 + (long)iVar11 * 4));
    *local_18 = uVar5;
    uVar5 = clamp(uVar7 + (iVar6 + iVar8 >> 0x10));
    local_18[1] = uVar5;
    uVar5 = clamp(uVar7 + iVar9);
    local_18[2] = uVar5;
    local_18[3] = 0xff;
    local_18 = local_18 + 4;
  }
  return;
}

Assistant:

void jpeg_decoder::H2V1ConvertFiltered()
	{
		const uint BLOCKS_PER_MCU = 4;
		int row = m_max_mcu_y_size - m_mcu_lines_left;
		uint8* d0 = m_pScan_line_0;

		const int half_image_x_size = (m_image_x_size >> 1) - 1;
		const int row_x8 = row * 8;

		for (int x = 0; x < m_image_x_size; x++)
		{
			int y = m_pSample_buf[check_sample_buf_ofs((x >> 4) * BLOCKS_PER_MCU * 64 + ((x & 8) ? 64 : 0) + (x & 7) + row_x8)];

			int c_x0 = (x - 1) >> 1;
			int c_x1 = JPGD_MIN(c_x0 + 1, half_image_x_size);
			c_x0 = JPGD_MAX(c_x0, 0);

			int a = (c_x0 >> 3) * BLOCKS_PER_MCU * 64 + (c_x0 & 7) + row_x8 + 128;
			int cb0 = m_pSample_buf[check_sample_buf_ofs(a)];
			int cr0 = m_pSample_buf[check_sample_buf_ofs(a + 64)];

			int b = (c_x1 >> 3) * BLOCKS_PER_MCU * 64 + (c_x1 & 7) + row_x8 + 128;
			int cb1 = m_pSample_buf[check_sample_buf_ofs(b)];
			int cr1 = m_pSample_buf[check_sample_buf_ofs(b + 64)];

			int w0 = (x & 1) ? 3 : 1;
			int w1 = (x & 1) ? 1 : 3;

			int cb = (cb0 * w0 + cb1 * w1 + 2) >> 2;
			int cr = (cr0 * w0 + cr1 * w1 + 2) >> 2;

			int rc = m_crr[cr];
			int gc = ((m_crg[cr] + m_cbg[cb]) >> 16);
			int bc = m_cbb[cb];

			d0[0] = clamp(y + rc);
			d0[1] = clamp(y + gc);
			d0[2] = clamp(y + bc);
			d0[3] = 255;

			d0 += 4;
		}
	}